

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_in_out_testing.cpp
# Opt level: O3

void execute_tests(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  FILE *__src;
  istream *piVar5;
  ostream *poVar6;
  undefined8 *puVar7;
  long *plVar8;
  uint uVar9;
  ulong uVar10;
  undefined8 *puVar11;
  size_type *psVar12;
  long lVar13;
  long *plVar14;
  ulong uVar15;
  uint uVar16;
  ulong *puVar17;
  uint uVar18;
  uint uVar19;
  uint __uval_1;
  uint uVar20;
  string out_line;
  string __str;
  string exp_line;
  uint __uval;
  string __str_2;
  ifstream expected_file;
  ifstream out_file;
  string local_588;
  string local_568;
  undefined8 *local_548;
  undefined8 local_540;
  undefined8 local_538;
  undefined8 uStack_530;
  ulong *local_528;
  long local_520;
  ulong local_518;
  long lStack_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  ulong local_4e8;
  ulong *local_4e0;
  long local_4d8;
  ulong local_4d0 [2];
  long *local_4c0;
  long local_4b8;
  long local_4b0;
  long lStack_4a8;
  long *local_4a0;
  long local_498;
  long local_490;
  long lStack_488;
  long *local_480;
  long local_478;
  long local_470;
  long lStack_468;
  ulong *local_460 [2];
  ulong local_450 [2];
  long local_440 [65];
  long local_238 [65];
  
  stop.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  fclose(_stdout);
  __src = fdopen(old_stdout,"w");
  memcpy(_stdout,__src,0xd8);
  std::ifstream::ifstream((istream *)local_238,(string *)&out_name_abi_cxx11_,_S_in);
  std::ifstream::ifstream(local_440,(string *)&expected_name_abi_cxx11_,_S_in);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    std::operator+(&local_508,"!! Problems reading from file \'",&out_name_abi_cxx11_);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_508);
    puVar17 = (ulong *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar17) {
      local_588.field_2._M_allocated_capacity = *puVar17;
      local_588.field_2._8_8_ = plVar8[3];
      local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
    }
    else {
      local_588.field_2._M_allocated_capacity = *puVar17;
      local_588._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_588._M_string_length = plVar8[1];
    *plVar8 = (long)puVar17;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    write_colored_text(&local_588,red);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_588._M_dataplus._M_p != &local_588.field_2) {
      operator_delete(local_588._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_508._M_dataplus._M_p != &local_508.field_2) {
      operator_delete(local_508._M_dataplus._M_p);
    }
    cVar3 = std::__basic_file<char>::is_open();
    if (cVar3 == '\0') goto LAB_00106c20;
  }
  else {
    cVar3 = std::__basic_file<char>::is_open();
    if (cVar3 != '\0') {
      paVar1 = &local_588.field_2;
      local_588._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_588,"\nExecuting tests:","");
      write_colored_text(&local_588,blue);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_588._M_dataplus._M_p != paVar1) {
        operator_delete(local_588._M_dataplus._M_p);
      }
      local_588._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_588,"\n----------------\n","");
      write_colored_text(&local_588,blue);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_588._M_dataplus._M_p != paVar1) {
        operator_delete(local_588._M_dataplus._M_p);
      }
      uVar15 = 0;
      local_588._M_string_length = 0;
      local_588.field_2._M_allocated_capacity =
           local_588.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
      local_508._M_string_length = 0;
      local_508.field_2._M_local_buf[0] = '\0';
      uVar16 = 0;
      local_588._M_dataplus._M_p = (pointer)paVar1;
      do {
        do {
          uVar10 = uVar15 & 0xffffffff;
          while( true ) {
            cVar3 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                                    (char)(istream *)local_238);
            piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                               ((istream *)local_238,(string *)&local_588,cVar3);
            if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) {
              goto LAB_00106948;
            }
            cVar3 = std::ios::widen((char)*(undefined8 *)(local_440[0] + -0x18) + (char)local_440);
            piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                               ((istream *)local_440,(string *)&local_508,cVar3);
            if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) == 0) break;
            local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_568,"You produced at least one line to much of output: ","")
            ;
            write_colored_text(&local_568,red);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_568._M_dataplus._M_p != &local_568.field_2) {
              operator_delete(local_568._M_dataplus._M_p);
            }
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,local_588._M_dataplus._M_p,
                                local_588._M_string_length);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
            std::ostream::put((char)poVar6);
            std::ostream::flush();
            uVar16 = uVar16 + 1;
          }
          uVar18 = (uint)uVar15;
          uVar15 = (ulong)(uVar18 + 1);
        } while ((local_588._M_string_length == local_508._M_string_length) &&
                ((local_588._M_string_length == 0 ||
                 (iVar4 = bcmp(local_588._M_dataplus._M_p,local_508._M_dataplus._M_p,
                               local_588._M_string_length), iVar4 == 0))));
        uVar19 = 1;
        if (8 < uVar18) {
          uVar10 = uVar15;
          uVar18 = 4;
          do {
            uVar19 = uVar18;
            uVar20 = (uint)uVar10;
            if (uVar20 < 100) {
              uVar19 = uVar19 - 2;
              goto LAB_001066c5;
            }
            if (uVar20 < 1000) {
              uVar19 = uVar19 - 1;
              goto LAB_001066c5;
            }
            if (uVar20 < 10000) goto LAB_001066c5;
            uVar10 = uVar10 / 10000;
            uVar18 = uVar19 + 4;
          } while (99999 < uVar20);
          uVar19 = uVar19 + 1;
        }
LAB_001066c5:
        local_528 = &local_518;
        local_4e8 = uVar15;
        std::__cxx11::string::_M_construct((ulong)&local_528,(char)uVar19);
        uVar15 = local_4e8;
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_528,uVar19,(uint)local_4e8);
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_528,0,(char *)0x0,0x11912b);
        local_548 = &local_538;
        puVar11 = puVar7 + 2;
        paVar1 = &local_568.field_2;
        if ((undefined8 *)*puVar7 == puVar11) {
          local_538 = *puVar11;
          uStack_530 = puVar7[3];
        }
        else {
          local_538 = *puVar11;
          local_548 = (undefined8 *)*puVar7;
        }
        local_540 = puVar7[1];
        *puVar7 = puVar11;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_548);
        psVar12 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_568.field_2._M_allocated_capacity = *psVar12;
          local_568.field_2._8_8_ = plVar8[3];
          local_568._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_568.field_2._M_allocated_capacity = *psVar12;
          local_568._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_568._M_string_length = plVar8[1];
        *plVar8 = (long)psVar12;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        write_colored_text(&local_568,red);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_568._M_dataplus._M_p != paVar1) {
          operator_delete(local_568._M_dataplus._M_p);
        }
        if (local_548 != &local_538) {
          operator_delete(local_548);
        }
        if (local_528 != &local_518) {
          operator_delete(local_528);
        }
        local_568._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_568,"Expected: ","");
        write_colored_text(&local_568,yellow);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_568._M_dataplus._M_p != paVar1) {
          operator_delete(local_568._M_dataplus._M_p);
        }
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_508._M_dataplus._M_p,
                            local_508._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\t",1);
        local_568._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_568,"Your output: ","");
        write_colored_text(&local_568,cyan);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_568._M_dataplus._M_p != paVar1) {
          operator_delete(local_568._M_dataplus._M_p);
        }
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_588._M_dataplus._M_p,
                            local_588._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        uVar16 = uVar16 + 1;
      } while( true );
    }
LAB_00106c20:
    std::operator+(&local_508,"!! Problems reading from file \'",&expected_name_abi_cxx11_);
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_508);
    puVar17 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar17) {
      local_588.field_2._M_allocated_capacity = *puVar17;
      local_588.field_2._8_8_ = puVar7[3];
      local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
    }
    else {
      local_588.field_2._M_allocated_capacity = *puVar17;
      local_588._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_588._M_string_length = puVar7[1];
    *puVar7 = puVar17;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    write_colored_text(&local_588,red);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_588._M_dataplus._M_p != &local_588.field_2) {
      operator_delete(local_588._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_508._M_dataplus._M_p != &local_508.field_2) {
      operator_delete(local_508._M_dataplus._M_p);
    }
  }
  local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_588,"-> Tests will be skipped !!\n","");
  write_colored_text(&local_588,red);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._M_dataplus._M_p == &local_588.field_2) goto LAB_00106cfe;
  goto LAB_00106cf9;
LAB_00106948:
  cVar3 = std::ios::widen((char)*(undefined8 *)(local_440[0] + -0x18) + (char)local_440);
  piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                     ((istream *)local_440,(string *)&local_508,cVar3);
  uVar18 = (uint)uVar10;
  if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) goto LAB_00106b55;
  uVar20 = uVar18 + 1;
  uVar19 = 1;
  if (8 < uVar18) {
    uVar18 = uVar20;
    uVar9 = 4;
    do {
      uVar19 = uVar9;
      if (uVar18 < 100) {
        uVar19 = uVar19 - 2;
        goto LAB_001069e0;
      }
      if (uVar18 < 1000) {
        uVar19 = uVar19 - 1;
        goto LAB_001069e0;
      }
      if (uVar18 < 10000) goto LAB_001069e0;
      bVar2 = 99999 < uVar18;
      uVar18 = uVar18 / 10000;
      uVar9 = uVar19 + 4;
    } while (bVar2);
    uVar19 = uVar19 + 1;
  }
LAB_001069e0:
  local_528 = &local_518;
  std::__cxx11::string::_M_construct((ulong)&local_528,(char)uVar19);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_528,uVar19,uVar20);
  puVar7 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_528,0,(char *)0x0,0x119187);
  puVar11 = puVar7 + 2;
  if ((undefined8 *)*puVar7 == puVar11) {
    local_538 = *puVar11;
    uStack_530 = puVar7[3];
    local_548 = &local_538;
  }
  else {
    local_538 = *puVar11;
    local_548 = (undefined8 *)*puVar7;
  }
  local_540 = puVar7[1];
  *puVar7 = puVar11;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_548);
  local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
  psVar12 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_568.field_2._M_allocated_capacity = *psVar12;
    local_568.field_2._8_8_ = puVar7[3];
  }
  else {
    local_568.field_2._M_allocated_capacity = *psVar12;
    local_568._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_568._M_string_length = puVar7[1];
  *puVar7 = psVar12;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  write_colored_text(&local_568,red);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_568._M_dataplus._M_p != &local_568.field_2) {
    operator_delete(local_568._M_dataplus._M_p);
  }
  if (local_548 != &local_538) {
    operator_delete(local_548);
  }
  if (local_528 != &local_518) {
    operator_delete(local_528);
  }
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_508._M_dataplus._M_p,local_508._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  uVar16 = uVar16 + 1;
  uVar10 = (ulong)uVar20;
  goto LAB_00106948;
LAB_00106b55:
  if ((int)uVar16 < 1) {
    uVar16 = 1;
    if (9 < uVar18) {
      uVar19 = 4;
      do {
        uVar16 = uVar19;
        uVar20 = (uint)uVar10;
        if (uVar20 < 100) {
          uVar16 = uVar16 - 2;
          goto LAB_001072f0;
        }
        if (uVar20 < 1000) {
          uVar16 = uVar16 - 1;
          goto LAB_001072f0;
        }
        if (uVar20 < 10000) goto LAB_001072f0;
        uVar10 = uVar10 / 10000;
        uVar19 = uVar16 + 4;
      } while (99999 < uVar20);
      uVar16 = uVar16 + 1;
    }
LAB_001072f0:
    local_528 = &local_518;
    std::__cxx11::string::_M_construct((ulong)&local_528,(char)uVar16);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_528,uVar16,uVar18);
    puVar7 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_528,0,(char *)0x0,0x1191f3);
    puVar11 = puVar7 + 2;
    if ((undefined8 *)*puVar7 == puVar11) {
      local_538 = *puVar11;
      uStack_530 = puVar7[3];
      local_548 = &local_538;
    }
    else {
      local_538 = *puVar11;
      local_548 = (undefined8 *)*puVar7;
    }
    local_540 = puVar7[1];
    *puVar7 = puVar11;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_548);
    psVar12 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_568.field_2._M_allocated_capacity = *psVar12;
      local_568.field_2._8_8_ = puVar7[3];
      local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
    }
    else {
      local_568.field_2._M_allocated_capacity = *psVar12;
      local_568._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_568._M_string_length = puVar7[1];
    *puVar7 = psVar12;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    write_colored_text(&local_568,green);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_568._M_dataplus._M_p != &local_568.field_2) {
      operator_delete(local_568._M_dataplus._M_p);
    }
    if (local_548 != &local_538) {
      operator_delete(local_548);
    }
    puVar17 = local_528;
    if (local_528 != &local_518) goto LAB_001072b8;
  }
  else {
    uVar19 = 1;
    if (9 < uVar16) {
      uVar15 = (ulong)uVar16;
      uVar20 = 4;
      do {
        uVar19 = uVar20;
        uVar9 = (uint)uVar15;
        if (uVar9 < 100) {
          uVar19 = uVar19 - 2;
          goto LAB_00106eb9;
        }
        if (uVar9 < 1000) {
          uVar19 = uVar19 - 1;
          goto LAB_00106eb9;
        }
        if (uVar9 < 10000) goto LAB_00106eb9;
        uVar15 = uVar15 / 10000;
        uVar20 = uVar19 + 4;
      } while (99999 < uVar9);
      uVar19 = uVar19 + 1;
    }
LAB_00106eb9:
    local_460[0] = local_450;
    std::__cxx11::string::_M_construct((ulong)local_460,(char)uVar19);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_460[0],uVar19,uVar16);
    plVar8 = (long *)std::__cxx11::string::replace((ulong)local_460,0,(char *)0x0,0x1191b0);
    local_4c0 = &local_4b0;
    plVar14 = plVar8 + 2;
    if ((long *)*plVar8 == plVar14) {
      local_4b0 = *plVar14;
      lStack_4a8 = plVar8[3];
    }
    else {
      local_4b0 = *plVar14;
      local_4c0 = (long *)*plVar8;
    }
    local_4b8 = plVar8[1];
    *plVar8 = (long)plVar14;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_4c0);
    plVar14 = plVar8 + 2;
    if ((long *)*plVar8 == plVar14) {
      local_490 = *plVar14;
      lStack_488 = plVar8[3];
      local_4a0 = &local_490;
    }
    else {
      local_490 = *plVar14;
      local_4a0 = (long *)*plVar8;
    }
    local_498 = plVar8[1];
    *plVar8 = (long)plVar14;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_4a0);
    plVar14 = plVar8 + 2;
    if ((long *)*plVar8 == plVar14) {
      local_470 = *plVar14;
      lStack_468 = plVar8[3];
      local_480 = &local_470;
    }
    else {
      local_470 = *plVar14;
      local_480 = (long *)*plVar8;
    }
    local_478 = plVar8[1];
    *plVar8 = (long)plVar14;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_480);
    puVar17 = (ulong *)(plVar8 + 2);
    if ((ulong *)*plVar8 == puVar17) {
      local_518 = *puVar17;
      lStack_510 = plVar8[3];
      local_528 = &local_518;
    }
    else {
      local_518 = *puVar17;
      local_528 = (ulong *)*plVar8;
    }
    local_520 = plVar8[1];
    *plVar8 = (long)puVar17;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    uVar16 = 1;
    if (9 < uVar18) {
      uVar19 = 4;
      do {
        uVar16 = uVar19;
        uVar20 = (uint)uVar10;
        if (uVar20 < 100) {
          uVar16 = uVar16 - 2;
          goto LAB_001070d0;
        }
        if (uVar20 < 1000) {
          uVar16 = uVar16 - 1;
          goto LAB_001070d0;
        }
        if (uVar20 < 10000) goto LAB_001070d0;
        uVar10 = uVar10 / 10000;
        uVar19 = uVar16 + 4;
      } while (99999 < uVar20);
      uVar16 = uVar16 + 1;
    }
LAB_001070d0:
    local_4e0 = local_4d0;
    std::__cxx11::string::_M_construct((ulong)&local_4e0,(char)uVar16);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_4e0,uVar16,uVar18);
    uVar15 = 0xf;
    if (local_528 != &local_518) {
      uVar15 = local_518;
    }
    if (uVar15 < (ulong)(local_4d8 + local_520)) {
      uVar15 = 0xf;
      if (local_4e0 != local_4d0) {
        uVar15 = local_4d0[0];
      }
      if (uVar15 < (ulong)(local_4d8 + local_520)) goto LAB_00107150;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_4e0,0,(char *)0x0,(ulong)local_528);
    }
    else {
LAB_00107150:
      puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_528,(ulong)local_4e0);
    }
    local_548 = &local_538;
    puVar11 = puVar7 + 2;
    if ((undefined8 *)*puVar7 == puVar11) {
      local_538 = *puVar11;
      uStack_530 = puVar7[3];
    }
    else {
      local_538 = *puVar11;
      local_548 = (undefined8 *)*puVar7;
    }
    local_540 = puVar7[1];
    *puVar7 = puVar11;
    puVar7[1] = 0;
    *(undefined1 *)puVar11 = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_548);
    local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
    psVar12 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_568.field_2._M_allocated_capacity = *psVar12;
      local_568.field_2._8_8_ = puVar7[3];
    }
    else {
      local_568.field_2._M_allocated_capacity = *psVar12;
      local_568._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_568._M_string_length = puVar7[1];
    *puVar7 = psVar12;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    write_colored_text(&local_568,magenta);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_568._M_dataplus._M_p != &local_568.field_2) {
      operator_delete(local_568._M_dataplus._M_p);
    }
    if (local_548 != &local_538) {
      operator_delete(local_548);
    }
    if (local_4e0 != local_4d0) {
      operator_delete(local_4e0);
    }
    if (local_528 != &local_518) {
      operator_delete(local_528);
    }
    if (local_480 != &local_470) {
      operator_delete(local_480);
    }
    if (local_4a0 != &local_490) {
      operator_delete(local_4a0);
    }
    if (local_4c0 != &local_4b0) {
      operator_delete(local_4c0);
    }
    puVar17 = local_460[0];
    if (local_460[0] != local_450) {
LAB_001072b8:
      operator_delete(puVar17);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._M_dataplus._M_p == &local_588.field_2) goto LAB_00106cfe;
LAB_00106cf9:
  operator_delete(local_588._M_dataplus._M_p);
LAB_00106cfe:
  std::ifstream::close();
  std::ifstream::close();
  lVar13 = (long)stop.__d.__r - (long)start.__d.__r;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Execution time for actual code: ",0x20);
  if (0x7ce < lVar13 / 1000 + 999U) {
    poVar6 = std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\'",1);
  }
  poVar6 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," microseconds",0xd);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::ifstream::~ifstream(local_440);
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void execute_tests() {

    // Stop the timer:
    stop = chrono::high_resolution_clock::now();

    /*
     * Recreate the standard output to the terminal:
     * https://stackoverflow.com/questions/1908687/how-to-redirect-the-output-back-to-the-screen-after-freopenout-txt-a-stdo/1910044#1910044
     * Somehow, this only works once - the second time, the output didn't work anymore 
     *    (e.g., when I tried to call this file string_in_out_testing.cpp in a loop)
     */
    fclose(stdout);
    FILE *fp_out = fdopen(old_stdout, "w");    // Open old stdout as a stream
    // Reassign the terminal to stdin/stdout:
    *stdout = *fp_out;                          // NOLINT(misc-non-copyable-objects)

    /*
     * Recreate the standard input to the terminal.
     * DOESN'T YET WORK ?!   
     * (But this is not necessary for this project, except if I would want to run multiple times in a sequence)
     */
//    fclose(stdin);
//    FILE  *fp_in = fdopen(old_stdin, "r");  // Open old stdin as a stream
//    *stdin = *fp_in;                        // NOLINT(misc-non-copyable-objects)



    // Open 'out_name' and 'expected_name' for 'r'-access:
    // see https://www.tutorialspoint.com/cplusplus/cpp_files_streams.htm
    // ifstream ... : represents input file stream (for reading from files)
    // ofstream ... : represents output file stream (for creating and writing to files)
    // For comparing, you only need reading:
    ifstream out_file(out_name);
    ifstream expected_file(expected_name);

    bool skip_tests = false;
    if (!out_file.is_open()) {
        write_colored_text("!! Problems reading from file '" + out_name + "'\n");
        skip_tests = true;
    }
    if (!expected_file.is_open()) {
        write_colored_text("!! Problems reading from file '" + expected_name + "'\n");
        skip_tests = true;
    }

    // Run actual tests: do string-comparison line by line
    if (skip_tests) {
        write_colored_text("-> Tests will be skipped !!\n");
    } else {
        write_colored_text("\nExecuting tests:", blue);
        write_colored_text("\n----------------\n", blue);
//        cout << "\n----------------" << endl;
        int line_nr = 0, error_count = 0;
        string out_line, exp_line;

        while (getline(out_file, out_line)) {
            if (getline(expected_file, exp_line)) {
                line_nr++;
                /*
                 * NOTE: I wanted to compare the two string as described in
                 * various online resources, such as https://www.geeksforgeeks.org/stdstringcompare-in-c/
                 * With:
                 *      if (out_line.compare(exp_line) == 0)
                 * But CLion showed "Clang-Tidy: Do not use 'compare' to test equality of strings; use the string
                 *      equality operator instead"
                 *
                 * It seems the above construct would be great to see if a string is shorter or longer than the other:
                 *      int difference = out_line.compare(exp_line);
                 *
                 * But here, I only want to know if they are the same.
                 * -> after automatic refactoring
                 */
                if (out_line != exp_line) {
                    write_colored_text("Error: Line " + to_string(line_nr) + ":\t");
                    write_colored_text("Expected: ", yellow);
                    cout << exp_line << "\t";
                    write_colored_text("Your output: ", cyan);
                    cout << out_line << endl;
                    error_count++;
                }
            } else {
                write_colored_text("You produced at least one line to much of output: ");
                cout << out_line << endl;
                error_count++;
            }
        }

        // Check, if 'expected' has more lines than 'out':
        while (getline(expected_file, exp_line)) {
            line_nr++;
            write_colored_text("You failed to produce expected line " + to_string(line_nr) + ":  ");
            cout << exp_line << endl;
            error_count++;
        }

        if (error_count > 0) {
            write_colored_text(
                    "You produced " + to_string(error_count) + " wrong line" + (error_count == 1 ? "" : "s") +
                    " of totally " + to_string(line_nr) + " lines of expected output!\n",
                    magenta);
        } else {
            write_colored_text("Yes, no errors, all " + to_string(line_nr) + " lines of output are correct!\n",
                               green);
        }
    }

    out_file.close();
    expected_file.close();

    // Subtract stop and start time-points and cast it to required unit. 
    // Predefined units are: nanoseconds, microseconds, milliseconds, seconds, minutes, hours.
    // Use duration_cast() function: 
    long int micro = chrono::duration_cast<chrono::microseconds>(stop - start).count();
    long int milli = micro / 1000;
    micro %= 1000;
    cout << "Execution time for actual code: ";
    if (milli) cout << milli << "'";
    cout << micro << " microseconds" << endl;
}